

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseLast
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t uVar2;
  MapFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  MessageLite *pMVar3;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *pVVar4;
  char *description;
  Descriptor *expected;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection == this) {
    expected = this->descriptor_;
    if (field->containing_type_ == expected) {
      if (0xbf < (byte)field->field_0x1) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 10) {
          anon_unknown_6::ReportReflectionUsageTypeError
                    (expected,field,"UnsafeArenaReleaseLast",CPPTYPE_MESSAGE);
        }
        if ((field->field_0x1 & 8) != 0) {
          uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          pMVar3 = internal::ExtensionSet::UnsafeArenaReleaseLast
                             ((ExtensionSet *)
                              ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
                              ,field->number_);
          return (Message *)pMVar3;
        }
        if (field->type_ == 0xb) {
          bVar1 = FieldDescriptor::is_map_message_type(field);
          if (bVar1) {
            this_00 = (MapFieldBase *)MutableRawImpl(this,message,field);
            this_01 = internal::MapFieldBase::MutableRepeatedField(this_00);
            goto LAB_00274b1e;
          }
        }
        this_01 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
LAB_00274b1e:
        pVVar4 = internal::RepeatedPtrFieldBase::
                 UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           (this_01);
        return pVVar4;
      }
      description = "Field is singular; the method requires a repeated field.";
      goto LAB_00274b69;
    }
  }
  else {
    expected = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (expected,MVar5.descriptor,field,"UnsafeArenaReleaseLast");
  }
  description = "Field does not match message type.";
LAB_00274b69:
  anon_unknown_6::ReportReflectionUsageError(expected,field,"UnsafeArenaReleaseLast",description);
}

Assistant:

Message* Reflection::UnsafeArenaReleaseLast(
    Message* message, const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(UnsafeArenaReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseLast(field->number()));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->UnsafeArenaReleaseLast<GenericTypeHandler<Message>>();
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
          ->UnsafeArenaReleaseLast<GenericTypeHandler<Message>>();
    }
  }
}